

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSR.cpp
# Opt level: O1

void __thiscall CSR::CSR(CSR *this,int r,int c,int nz,int *p,int *ind,double *x)

{
  int *__s;
  int *__s_00;
  double *__s_01;
  uint uVar1;
  ulong uVar2;
  ulong __n;
  
  this->row = r;
  this->col = c;
  this->nonzero = nz;
  uVar2 = (long)r * 4 + 4;
  if (r < -1) {
    uVar2 = 0xffffffffffffffff;
  }
  __s = (int *)operator_new__(uVar2);
  memset(__s,0,uVar2);
  this->ptr = __s;
  uVar2 = (long)nz * 4;
  if (nz < 0) {
    uVar2 = 0xffffffffffffffff;
  }
  __n = (long)nz * 8;
  if (nz < 0) {
    __n = 0xffffffffffffffff;
  }
  __s_00 = (int *)operator_new__(uVar2);
  memset(__s_00,0,uVar2);
  this->idx = __s_00;
  __s_01 = (double *)operator_new__(__n);
  memset(__s_01,0,__n);
  this->val = __s_01;
  if (-1 < this->row) {
    uVar2 = 0;
    if (0 < this->row) {
      uVar2 = (ulong)(uint)this->row;
    }
    memcpy(__s,p,uVar2 * 4 + 4);
  }
  uVar1 = this->nonzero;
  if (0 < (int)uVar1) {
    uVar1 = this->nonzero;
    uVar2 = 1;
    if (1 < (int)uVar1) {
      uVar2 = (ulong)uVar1;
    }
    memcpy(__s_00,ind,uVar2 << 2);
  }
  if (0 < (int)uVar1) {
    memcpy(__s_01,x,(ulong)uVar1 << 3);
    return;
  }
  return;
}

Assistant:

CSR::CSR(int r, int c, int nz, int *p, int *ind, double *x)
{
    row = r;
    col = c;
    nonzero = nz;
    ptr = new int[row+1]();
    idx = new int[nonzero]();
    val = new double[nonzero]();

    for(int i=0; i<row+1; i++)
    {
        ptr[i] = p[i];
    }
    for(int i=0; i<nonzero; i++)
    {
        idx[i] = ind[i];
    }
    for(int i=0; i<nonzero; i++)
    {
        val[i] = x[i];
    }

}